

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBuilderBeamTaperedTimoshenko::BuildBeam
          (ChBuilderBeamTaperedTimoshenko *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *sect,int N,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *nodeA,ChVector<double> *B,ChVector<double> *Ydir
          )

{
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *this_00;
  ChKblockGeneric *pCVar1;
  element_type *peVar2;
  ChMesh *pCVar3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  char cVar11;
  ChNodeFEAxyzrot *this_01;
  ChElementBeamTaperedTimoshenko *pCVar12;
  ChVector<double> *pCVar13;
  int iVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ChVector<double> v;
  ChMatrix33<double> mrot;
  ChVector<double> mZ;
  ChVector<double> mX;
  ChVector<double> mY;
  ChVector<double> local_258;
  element_type *local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238;
  undefined8 local_230;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  undefined8 local_220;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_218;
  shared_ptr<chrono::fea::ChElementBase> local_210;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_200;
  ChMatrix33<double> local_1f0;
  ChVector<double> local_1a8;
  long local_190;
  _func_int **local_188;
  double local_180;
  shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *local_178;
  ChBuilderBeamTaperedTimoshenko *local_170;
  ChVector<double> *local_168;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> *local_160;
  ChFrame<double> local_158;
  undefined1 local_c8 [16];
  ChFrame<double> local_b8;
  
  local_178 = sect;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>_>_>
  ::clear(&this->beam_elems);
  this_00 = &this->beam_nodes;
  local_170 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(this_00);
  peVar2 = (nodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_258.m_data[0] = B->m_data[0] - *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20;
  local_258.m_data[1] = B->m_data[1] - *(double *)&peVar2->field_0x28;
  local_258.m_data[2] = B->m_data[2] - *(double *)&peVar2->field_0x30;
  local_158.coord.pos.m_data[1] = 0.0;
  local_158._vptr_ChFrame = (_func_int **)0x0;
  local_158.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[1] = 0.0;
  local_b8._vptr_ChFrame = (_func_int **)0x0;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_1a8.m_data[2] = 0.0;
  local_1a8.m_data[0] = 0.0;
  local_1a8.m_data[1] = 0.0;
  local_168 = B;
  ChVector<double>::DirToDxDyDz
            (&local_258,(ChVector<double> *)&local_158,(ChVector<double> *)&local_b8,&local_1a8,Ydir
            );
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_158._vptr_ChFrame;
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)local_b8._vptr_ChFrame;
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_1a8.m_data[0];
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_158.coord.pos.m_data[0];
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_b8.coord.pos.m_data[0];
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_1a8.m_data[1];
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_158.coord.pos.m_data[1];
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_b8.coord.pos.m_data[1];
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_1a8.m_data[2];
  local_160 = nodeA;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(this_00,nodeA);
  if (0 < N) {
    local_180 = (double)N;
    local_190 = (ulong)(uint)N << 4;
    iVar14 = 1;
    lVar15 = 0;
    local_188 = (_func_int **)&PTR__ChFrame_00b2b308;
    do {
      dVar16 = (double)iVar14 / local_180;
      peVar2 = (local_160->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_1a8.m_data[0] = *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20;
      local_1a8.m_data[0] =
           local_1a8.m_data[0] + dVar16 * (local_168->m_data[0] - local_1a8.m_data[0]);
      local_1a8.m_data[1] =
           *(double *)&peVar2->field_0x28 +
           dVar16 * (local_168->m_data[1] - *(double *)&peVar2->field_0x28);
      local_1a8.m_data[2] =
           *(double *)&peVar2->field_0x30 +
           dVar16 * (local_168->m_data[2] - *(double *)&peVar2->field_0x30);
      pCVar13 = &local_1a8;
      ChFrame<double>::ChFrame(&local_b8,pCVar13,&local_1f0);
      this_01 = (ChNodeFEAxyzrot *)
                ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)pCVar13);
      local_158._vptr_ChFrame = local_188;
      local_158.coord.pos.m_data[0] = local_b8.coord.pos.m_data[0];
      local_158.coord.pos.m_data[1] = local_b8.coord.pos.m_data[1];
      local_158.coord.pos.m_data[2] = local_b8.coord.pos.m_data[2];
      local_158.coord.rot.m_data[0] = local_b8.coord.rot.m_data[0];
      local_158.coord.rot.m_data[1] = local_b8.coord.rot.m_data[1];
      local_158.coord.rot.m_data[2] = local_b8.coord.rot.m_data[2];
      local_158.coord.rot.m_data[3] = local_b8.coord.rot.m_data[3];
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      ChNodeFEAxyzrot::ChNodeFEAxyzrot(this_01,&local_158);
      local_258.m_data[0] = (double)this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258.m_data + 1),this_01);
      pCVar3 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_200.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_258.m_data[0];
      local_200.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.m_data[1];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.m_data[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)local_258.m_data[1] + 8) =
               *(_Atomic_word *)((long)local_258.m_data[1] + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)local_258.m_data[1] + 8) =
               *(_Atomic_word *)((long)local_258.m_data[1] + 8) + 1;
        }
      }
      ChMesh::AddNode(pCVar3,&local_200);
      if (local_200.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_200.
                   super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pCVar13 = &local_258;
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(this_00,(value_type *)pCVar13);
      pCVar12 = (ChElementBeamTaperedTimoshenko *)
                ChElementBeamTaperedTimoshenko::operator_new
                          ((ChElementBeamTaperedTimoshenko *)0x238,(size_t)pCVar13);
      ChElementBeamTaperedTimoshenko::ChElementBeamTaperedTimoshenko(pCVar12);
      local_158._vptr_ChFrame = (_func_int **)pCVar12;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementBeamTaperedTimoshenko*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_158.coord,pCVar12);
      pCVar3 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_210.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_158._vptr_ChFrame;
      local_210.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.coord.pos.m_data[0];
      if ((ChElementBeamTaperedTimoshenko *)local_158.coord.pos.m_data[0] !=
          (ChElementBeamTaperedTimoshenko *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pCVar1 = &(((ChElementBeam *)local_158.coord.pos.m_data[0])->super_ChElementGeneric).Kmatr
          ;
          *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock + 1;
          UNLOCK();
        }
        else {
          pCVar1 = &(((ChElementBeam *)local_158.coord.pos.m_data[0])->super_ChElementGeneric).Kmatr
          ;
          *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock + 1;
        }
      }
      ChMesh::AddElement(pCVar3,&local_210);
      if ((ChElementBeamTaperedTimoshenko *)
          local_210.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (ChElementBeamTaperedTimoshenko *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_210.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>_>_>
      ::push_back(&local_170->beam_elems,(value_type *)&local_158);
      psVar4 = (this_00->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_220 = *(undefined8 *)
                   ((long)&(psVar4->
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + lVar15);
      local_218 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(psVar4->
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           )._M_refcount._M_pi + lVar15);
      if (local_218 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_218->_M_use_count = local_218->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_218->_M_use_count = local_218->_M_use_count + 1;
        }
      }
      psVar4 = (this_00->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_230 = *(undefined8 *)
                   ((long)&psVar4[1].
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + lVar15);
      local_228 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&psVar4[1].
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + lVar15);
      if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_228->_M_use_count = local_228->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_228->_M_use_count = local_228->_M_use_count + 1;
        }
      }
      (*(((ChElementBeam *)local_158._vptr_ChFrame)->super_ChElementGeneric).super_ChElementBase.
        _vptr_ChElementBase[0x1a])(local_158._vptr_ChFrame,&local_220,&local_230);
      if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
      }
      if (local_218 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218);
      }
      dVar10 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
      dVar9 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
      ;
      dVar8 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
      ;
      dVar7 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
      ;
      dVar40 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2];
      dVar6 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
      ;
      dVar16 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0] + local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[4] +
               local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
      if (0.0 <= dVar16) {
        dVar16 = dVar16 + 1.0;
        if (dVar16 < 0.0) {
          dVar16 = sqrt(dVar16);
        }
        else {
          auVar18._8_8_ = 0;
          auVar18._0_8_ = dVar16;
          auVar18 = vsqrtsd_avx(auVar18,auVar18);
          dVar16 = auVar18._0_8_;
        }
        dVar17 = dVar16 * 0.5;
        dVar16 = 0.5 / dVar16;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = (dVar10 - dVar8) * dVar16;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = (dVar40 - dVar9) * dVar16;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = (dVar7 - dVar6) * dVar16;
      }
      else {
        cVar11 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0] < local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[4];
        pCVar12 = (ChElementBeamTaperedTimoshenko *)
                  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0];
        if ((bool)cVar11) {
          pCVar12 = (ChElementBeamTaperedTimoshenko *)
                    local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[4];
        }
        if ((double)pCVar12 <
            local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8])
        {
          cVar11 = '\x02';
        }
        if (cVar11 == '\x02') {
          dVar16 = ((local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8] -
                    local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[0]) -
                   local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4]) + 1.0;
          if (dVar16 < 0.0) {
            dVar17 = sqrt(dVar16);
          }
          else {
            auVar20._8_8_ = 0;
            auVar20._0_8_ = dVar16;
            auVar18 = vsqrtsd_avx(auVar20,auVar20);
            dVar17 = auVar18._0_8_;
          }
          auVar38._8_8_ = 0;
          auVar38._0_8_ = dVar17 * 0.5;
          dVar17 = 0.5 / dVar17;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = (dVar40 + dVar9) * dVar17;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = (dVar8 + dVar10) * dVar17;
          dVar40 = dVar7 - dVar6;
        }
        else if (cVar11 == '\x01') {
          dVar16 = ((local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[4] -
                    local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[8]) -
                   local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0]) + 1.0;
          if (dVar16 < 0.0) {
            dVar17 = sqrt(dVar16);
          }
          else {
            auVar19._8_8_ = 0;
            auVar19._0_8_ = dVar16;
            auVar18 = vsqrtsd_avx(auVar19,auVar19);
            dVar17 = auVar18._0_8_;
          }
          auVar39._8_8_ = 0;
          auVar39._0_8_ = dVar17 * 0.5;
          dVar17 = 0.5 / dVar17;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = (dVar8 + dVar10) * dVar17;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = (dVar6 + dVar7) * dVar17;
          dVar40 = dVar40 - dVar9;
        }
        else {
          dVar16 = ((local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0] -
                    local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[4]) -
                   local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8]) + 1.0;
          if (dVar16 < 0.0) {
            dVar17 = sqrt(dVar16);
          }
          else {
            auVar21._8_8_ = 0;
            auVar21._0_8_ = dVar16;
            auVar18 = vsqrtsd_avx(auVar21,auVar21);
            dVar17 = auVar18._0_8_;
          }
          auVar41._8_8_ = 0;
          auVar41._0_8_ = dVar17 * 0.5;
          dVar17 = 0.5 / dVar17;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = (dVar6 + dVar7) * dVar17;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = (dVar40 + dVar9) * dVar17;
          dVar40 = dVar10 - dVar8;
        }
        dVar17 = dVar40 * dVar17;
      }
      psVar4 = (((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  *)((long)local_158._vptr_ChFrame + 0xb0))->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      peVar2 = (psVar4->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      p_Var5 = (psVar4->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      dVar40 = auVar41._0_8_;
      auVar46._0_8_ = -dVar40;
      auVar46._8_8_ = auVar41._8_8_ ^ 0x8000000000000000;
      auVar45._0_8_ = -auVar39._0_8_;
      auVar45._8_8_ = auVar39._8_8_ ^ 0x8000000000000000;
      auVar47._0_8_ = -auVar38._0_8_;
      auVar47._8_8_ = auVar38._8_8_ ^ 0x8000000000000000;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)&peVar2->field_0x48;
      dVar16 = *(double *)&peVar2->field_0x38;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar16;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(double *)&peVar2->field_0x40;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)&peVar2->field_0x50;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = auVar47._0_8_ * dVar16;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = dVar17;
      auVar18 = vfmadd231sd_fma(auVar32,auVar43,auVar30);
      auVar18 = vfmadd231sd_fma(auVar18,auVar39,auVar26);
      auVar18 = vfmadd231sd_fma(auVar18,auVar46,auVar22);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = auVar45._0_8_ * dVar16;
      auVar20 = vfmadd231sd_fma(auVar34,auVar43,auVar22);
      auVar20 = vfmadd231sd_fma(auVar20,auVar47,auVar26);
      auVar20 = vfmadd231sd_fma(auVar20,auVar41,auVar30);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = auVar46._0_8_ * dVar16;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = dVar17;
      auVar21 = vfmadd231sd_fma(auVar36,auVar44,auVar26);
      auVar21 = vfmadd231sd_fma(auVar21,auVar38,auVar22);
      auVar21 = vfmadd231sd_fma(auVar21,auVar45,auVar30);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar40 * *(double *)&peVar2->field_0x40;
      auVar19 = vfmadd231sd_fma(auVar27,auVar44,auVar24);
      auVar19 = vfmadd231sd_fma(auVar19,auVar39,auVar22);
      auVar19 = vfmadd231sd_fma(auVar19,auVar38,auVar30);
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x168))->m_data[0] = auVar19._0_8_;
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x168))->m_data[1] = auVar21._0_8_;
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x168))->m_data[2] = auVar20._0_8_;
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x168))->m_data[3] = auVar18._0_8_;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_c8 = auVar47;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        auVar47 = local_c8;
      }
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar17;
      psVar4 = (((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  *)((long)local_158._vptr_ChFrame + 0xb0))->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      peVar2 = psVar4[1].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var5 = psVar4[1].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)&peVar2->field_0x48;
      dVar16 = *(double *)&peVar2->field_0x38;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar16;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(double *)&peVar2->field_0x40;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)&peVar2->field_0x50;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = auVar47._0_8_ * dVar16;
      auVar18 = vfmadd231sd_fma(auVar33,auVar42,auVar31);
      auVar18 = vfmadd231sd_fma(auVar18,auVar39,auVar28);
      auVar18 = vfmadd231sd_fma(auVar18,auVar46,auVar23);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = auVar45._0_8_ * dVar16;
      auVar20 = vfmadd231sd_fma(auVar35,auVar42,auVar23);
      auVar20 = vfmadd231sd_fma(auVar20,auVar28,auVar47);
      auVar41 = vfmadd231sd_fma(auVar20,auVar41,auVar31);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = auVar46._0_8_ * dVar16;
      auVar20 = vfmadd231sd_fma(auVar37,auVar42,auVar28);
      auVar20 = vfmadd231sd_fma(auVar20,auVar38,auVar23);
      auVar20 = vfmadd231sd_fma(auVar20,auVar31,auVar45);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar40 * *(double *)&peVar2->field_0x40;
      auVar21 = vfmadd231sd_fma(auVar29,auVar42,auVar25);
      auVar39 = vfmadd231sd_fma(auVar21,auVar39,auVar23);
      auVar38 = vfmadd231sd_fma(auVar39,auVar38,auVar31);
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x188))->m_data[0] = auVar38._0_8_;
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x188))->m_data[1] = auVar20._0_8_;
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x188))->m_data[2] = auVar41._0_8_;
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x188))->m_data[3] = auVar18._0_8_;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      local_240 = (local_178->
                  super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      local_238._M_pi =
           (local_178->
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
      if (local_238._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_238._M_pi)->_M_use_count = (local_238._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_238._M_pi)->_M_use_count = (local_238._M_pi)->_M_use_count + 1;
        }
      }
      (((shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *)
       ((long)local_158._vptr_ChFrame + 200))->
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = local_240;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(((shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *)
                   ((long)local_158._vptr_ChFrame + 200))->
                  super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,&local_238);
      if (local_238._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238._M_pi);
      }
      if ((ChElementBeamTaperedTimoshenko *)local_158.coord.pos.m_data[0] !=
          (ChElementBeamTaperedTimoshenko *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.coord.pos.m_data[0]);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.m_data[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.m_data[1]);
      }
      iVar14 = iVar14 + 1;
      lVar15 = lVar15 + 0x10;
    } while (local_190 != lVar15);
  }
  return;
}

Assistant:

void ChBuilderBeamTaperedTimoshenko::BuildBeam(
    std::shared_ptr<ChMesh> mesh,              // mesh to store the resulting elements
    std::shared_ptr<ChBeamSectionTaperedTimoshenkoAdvancedGeneric> sect,  // section material for beam elements
                                   const int N,                               // number of elements in the segment
                                   std::shared_ptr<ChNodeFEAxyzrot> nodeA,    // starting point
                                   const ChVector<> B,                        // ending point
                                   const ChVector<> Ydir                      // the 'up' Y direction of the beam
) {
    beam_elems.clear();
    beam_nodes.clear();

    ChMatrix33<> mrot;
    mrot.Set_A_Xdir(B - nodeA->Frame().GetPos(), Ydir);

    beam_nodes.push_back(nodeA);

    for (int i = 1; i <= N; ++i) {
        double eta = (double)i / (double)N;
        ChVector<> pos = nodeA->Frame().GetPos() + (B - nodeA->Frame().GetPos()) * eta;

        auto nodeBi = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
        mesh->AddNode(nodeBi);
        beam_nodes.push_back(nodeBi);

        auto element = chrono_types::make_shared<ChElementBeamTaperedTimoshenko>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i - 1], beam_nodes[i]);

        ChQuaternion<> elrot = mrot.Get_A_quaternion();
        element->SetNodeAreferenceRot(elrot.GetConjugate() % element->GetNodeA()->Frame().GetRot());
        element->SetNodeBreferenceRot(elrot.GetConjugate() % element->GetNodeB()->Frame().GetRot());
        // GetLog() << "Element n." << i << " with rotations: \n";
        // GetLog() << "   Qa=" << element->GetNodeAreferenceRot() << "\n";
        // GetLog() << "   Qb=" << element->GetNodeBreferenceRot() << "\n\n";
        element->SetTaperedSection(sect);
    }
}